

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O0

void __thiscall rr::VertexPacketAllocator::~VertexPacketAllocator(VertexPacketAllocator *this)

{
  size_type sVar1;
  reference ppcVar2;
  ulong local_18;
  size_t i;
  VertexPacketAllocator *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<signed_char_*,_std::allocator<signed_char_*>_>::size(&this->m_allocations);
    if (sVar1 <= local_18) break;
    ppcVar2 = std::vector<signed_char_*,_std::allocator<signed_char_*>_>::operator[]
                        (&this->m_allocations,local_18);
    if (*ppcVar2 != (value_type)0x0) {
      operator_delete__(*ppcVar2);
    }
    local_18 = local_18 + 1;
  }
  std::vector<signed_char_*,_std::allocator<signed_char_*>_>::clear(&this->m_allocations);
  std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~vector
            (&this->m_singleAllocPool);
  std::vector<signed_char_*,_std::allocator<signed_char_*>_>::~vector(&this->m_allocations);
  return;
}

Assistant:

VertexPacketAllocator::~VertexPacketAllocator (void)
{
	for (size_t i = 0; i < m_allocations.size(); ++i)
		delete [] m_allocations[i];
	m_allocations.clear();
}